

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

Status google::protobuf::anon_unknown_21::ValidateFeatureSupport
                 (FeatureSupport *support,string_view full_name)

{
  uint uVar1;
  char *in_RCX;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  
  args_1._M_str = full_name._M_str;
  sVar2 = full_name._M_len;
  uVar1 = *(uint *)(sVar2 + 0x10);
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 1) != 0) goto LAB_00251375;
  }
  else if (((*(int *)(sVar2 + 0x24) < *(int *)(sVar2 + 0x20)) || ((uVar1 & 1) == 0)) ||
          ((uVar1 & 4) == 0)) goto LAB_00251375;
  if (((uVar1 & 8) == 0) ||
     ((*(int *)(sVar2 + 0x24) < *(int *)(sVar2 + 0x28) &&
      (*(int *)(sVar2 + 0x20) <= *(int *)(sVar2 + 0x28))))) {
    (support->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)0x1;
    return (Status)(uintptr_t)support;
  }
LAB_00251375:
  args_1._M_len = (size_t)"Feature ";
  protobuf::(anonymous_namespace)::
  Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
            ((char *)support,args_1,in_RCX);
  return (Status)(uintptr_t)support;
}

Assistant:

absl::Status ValidateFeatureSupport(const FieldOptions::FeatureSupport& support,
                                    absl::string_view full_name) {
  if (support.has_edition_deprecated()) {
    if (support.edition_deprecated() < support.edition_introduced()) {
      return Error("Feature ", full_name,
                   " was deprecated before it was introduced.");
    }
    if (!support.has_deprecation_warning()) {
      return Error(
          "Feature ", full_name,
          " is deprecated but does not specify a deprecation warning.");
    }
  }
  if (!support.has_edition_deprecated() && support.has_deprecation_warning()) {
    return Error("Feature ", full_name,
                 " specifies a deprecation warning but is not marked "
                 "deprecated in any edition.");
  }
  if (support.has_edition_removed()) {
    if (support.edition_deprecated() >= support.edition_removed()) {
      return Error("Feature ", full_name,
                   " was deprecated after it was removed.");
    }
    if (support.edition_removed() < support.edition_introduced()) {
      return Error("Feature ", full_name,
                   " was removed before it was introduced.");
    }
  }

  return absl::OkStatus();
}